

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

ParserResult * __thiscall
Catch::clara::detail::
BoundLambda<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/diatomic[P]diy/tests/catch.hpp:9801:34)>
::setValue(ParserResult *__return_storage_ptr__,
          BoundLambda<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_diatomic[P]diy_tests_catch_hpp:9801:34)>
          *this,string *arg)

{
  long lVar1;
  int iVar2;
  Singleton<Catch::(anonymous_namespace)::RegistryHub,_Catch::IRegistryHub,_Catch::IMutableRegistryHub>
  *pSVar3;
  undefined4 extraout_var;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Catch::IReporterFactory>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Catch::IReporterFactory>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Catch::IReporterFactory>_>_>_>
  *this_00;
  const_iterator cVar4;
  long *plVar5;
  long *plVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> temp;
  string lcReporter;
  long *local_e0;
  long local_d0;
  undefined4 uStack_c8;
  undefined4 uStack_c4;
  string local_c0;
  string local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  undefined **local_60;
  undefined8 local_58;
  undefined1 *local_50;
  undefined8 local_48;
  undefined1 local_40;
  undefined7 uStack_3f;
  
  local_c0._M_string_length = 0;
  local_c0.field_2._M_local_buf[0] = '\0';
  local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
  ::std::__cxx11::string::_M_assign((string *)&local_c0);
  local_58 = 0;
  local_60 = &PTR__BasicResult_001972e8;
  local_48 = 0;
  local_40 = 0;
  local_50 = &local_40;
  pSVar3 = Singleton<Catch::(anonymous_namespace)::RegistryHub,_Catch::IRegistryHub,_Catch::IMutableRegistryHub>
           ::getInternal();
  iVar2 = (*(pSVar3->super_RegistryHub).super_IRegistryHub._vptr_IRegistryHub[2])(pSVar3);
  this_00 = (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Catch::IReporterFactory>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Catch::IReporterFactory>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Catch::IReporterFactory>_>_>_>
             *)(**(code **)(*(long *)CONCAT44(extraout_var,iVar2) + 0x18))
                         ((long *)CONCAT44(extraout_var,iVar2));
  toLower(&local_a0,&local_c0);
  cVar4 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Catch::IReporterFactory>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Catch::IReporterFactory>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Catch::IReporterFactory>_>_>_>
          ::find(this_00,&local_a0);
  if (&(this_00->_M_impl).super__Rb_tree_header == (_Rb_tree_header *)cVar4._M_node) {
    ::std::operator+(&local_80,"Unrecognized reporter, \'",&local_c0);
    plVar5 = (long *)::std::__cxx11::string::append((char *)&local_80);
    plVar6 = plVar5 + 2;
    if ((long *)*plVar5 == plVar6) {
      local_d0 = *plVar6;
      uStack_c8 = (undefined4)plVar5[3];
      uStack_c4 = *(undefined4 *)((long)plVar5 + 0x1c);
      local_e0 = &local_d0;
    }
    else {
      local_d0 = *plVar6;
      local_e0 = (long *)*plVar5;
    }
    lVar1 = plVar5[1];
    *plVar5 = (long)plVar6;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    (__return_storage_ptr__->super_ResultValueBase<Catch::clara::detail::ParseResultType>).
    super_ResultBase.m_type = RuntimeError;
    (__return_storage_ptr__->super_ResultValueBase<Catch::clara::detail::ParseResultType>).
    super_ResultBase._vptr_ResultBase = (_func_int **)&PTR__BasicResult_001972e8;
    (__return_storage_ptr__->m_errorMessage)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->m_errorMessage).field_2;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&__return_storage_ptr__->m_errorMessage,local_e0,lVar1 + (long)local_e0);
    if (local_e0 != &local_d0) {
      operator_delete(local_e0,local_d0 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p != &local_80.field_2) {
      operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    ::std::__cxx11::string::_M_assign((string *)&((this->m_lambda).config)->reporterName);
    *(undefined8 *)
     &(__return_storage_ptr__->super_ResultValueBase<Catch::clara::detail::ParseResultType>).
      super_ResultBase.m_type = 0;
    (__return_storage_ptr__->super_ResultValueBase<Catch::clara::detail::ParseResultType>).
    super_ResultBase._vptr_ResultBase = (_func_int **)&PTR__BasicResult_001972e8;
    (__return_storage_ptr__->m_errorMessage)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->m_errorMessage).field_2;
    (__return_storage_ptr__->m_errorMessage)._M_string_length = 0;
    (__return_storage_ptr__->m_errorMessage).field_2._M_local_buf[0] = '\0';
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
    operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
  }
  local_60 = &PTR__BasicResult_001972e8;
  if (local_50 != &local_40) {
    operator_delete(local_50,CONCAT71(uStack_3f,local_40) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
    operator_delete(local_c0._M_dataplus._M_p,
                    CONCAT71(local_c0.field_2._M_allocated_capacity._1_7_,
                             local_c0.field_2._M_local_buf[0]) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

auto setValue( std::string const &arg ) -> ParserResult override {
            return invokeLambda<typename UnaryLambdaTraits<L>::ArgType>( m_lambda, arg );
        }